

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_binding.hpp
# Opt level: O0

istream * shadow::serialization_detail::serialization_type_selector<bool,_void>::
          deserialize_dispatch(istream *in,any *value)

{
  __type _Var1;
  decay_t<bool> *pdVar2;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  string boolstring;
  any *value_local;
  istream *in_local;
  
  boolstring.field_2._8_8_ = value;
  std::__cxx11::string::string((string *)local_38);
  std::operator>>(in,(string *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"true",&local_69);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  if (_Var1) {
    pdVar2 = any::get<bool>((any *)boolstring.field_2._8_8_);
    *pdVar2 = true;
  }
  else {
    pdVar2 = any::get<bool>((any *)boolstring.field_2._8_8_);
    *pdVar2 = false;
  }
  std::__cxx11::string::~string((string *)local_38);
  return in;
}

Assistant:

static std::istream&
    deserialize_dispatch(std::istream& in, any& value)
    {
        std::string boolstring;

        in >> boolstring;

        if(boolstring == std::string("true"))
        {
            value.get<bool>() = true;
        }
        else
        {
            value.get<bool>() = false;
        }

        return in;
    }